

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

interresult __thiscall
tetgenmesh::sscoutsegment
          (tetgenmesh *this,face *searchsh,point endpt,int insertsegflag,int reporterrorflag,
          int chkencflag)

{
  tetgenmesh *pa;
  shellface ppdVar1;
  shellface pb;
  bool bVar2;
  long lVar3;
  shellface *pppdVar4;
  undefined4 *puVar5;
  ulong uVar6;
  shellface *pppdVar7;
  uint uVar8;
  shellface unaff_RBP;
  shellface ppdVar9;
  int iVar10;
  char *pcVar11;
  int *this_00;
  face *flipfaces;
  bool bVar12;
  bool bVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double *in_stack_ffffffffffffff20;
  face flipshs [2];
  face newseg;
  undefined8 local_68;
  double tq;
  double tp;
  double Q [3];
  
  do {
    do {
      lVar3 = 0;
      do {
        *(undefined8 *)((long)&flipshs[0].sh + lVar3) = 0;
        *(undefined4 *)((long)&flipshs[0].shver + lVar3) = 0;
        lVar3 = lVar3 + 0x10;
      } while (lVar3 != 0x20);
      pa = (tetgenmesh *)searchsh->sh[sorgpivot[searchsh->shver]];
      this_00 = (int *)this;
      if (2 < this->b->verbose) {
        pcVar11 = "      Scout segment (%d, %d).\n";
        in_stack_ffffffffffffff20 = (double *)0x12e6df;
        printf("      Scout segment (%d, %d).\n",
               (ulong)*(uint *)((long)&pa->in + (long)this->pointmarkindex * 4),
               (ulong)*(uint *)((long)endpt + (long)this->pointmarkindex * 4));
        this_00 = (int *)pcVar11;
      }
      dVar17 = *endpt - (double)pa->in;
      dVar14 = endpt[1] - (double)pa->addin;
      dVar15 = endpt[2] - (double)pa->b;
      dVar14 = dVar15 * dVar15 + dVar17 * dVar17 + dVar14 * dVar14;
      if (dVar14 < 0.0) {
        in_stack_ffffffffffffff20 = (double *)0x12e72f;
        dVar14 = sqrt(dVar14);
      }
      else {
        dVar14 = SQRT(dVar14);
      }
      pppdVar4 = searchsh->sh;
      lVar3 = (long)searchsh->shver;
      ppdVar1 = pppdVar4[sdestpivot[lVar3]];
      ppdVar9 = unaff_RBP;
      while (ppdVar1 != (shellface)endpt) {
        ppdVar9 = pppdVar4[sapexpivot[lVar3]];
        bVar12 = ppdVar9 == (shellface)endpt;
        if (bVar12) {
LAB_0012ea69:
          bVar13 = ppdVar9 != (shellface)endpt;
          searchsh->shver = snextpivot[snextpivot[lVar3]] ^ 1;
          goto LAB_0012ea84;
        }
        dVar15 = triarea((tetgenmesh *)this_00,(double *)pa,(double *)ppdVar1,endpt);
        if (dVar15 < 0.0) {
          dVar15 = sqrt(dVar15);
        }
        else {
          dVar15 = SQRT(dVar15);
        }
        dVar17 = 0.0;
        if (this->b->epsilon <= dVar15 / dVar14) {
          this_00 = (int *)pa;
          dVar17 = orient3d((double *)pa,(double *)ppdVar1,this->dummypoint,endpt);
        }
        in_stack_ffffffffffffff20 = (double *)0x12e7eb;
        dVar15 = triarea((tetgenmesh *)this_00,(double *)ppdVar9,(double *)pa,endpt);
        if (dVar15 < 0.0) {
          in_stack_ffffffffffffff20 = (double *)0x12e803;
          dVar15 = sqrt(dVar15);
        }
        else {
          dVar15 = SQRT(dVar15);
        }
        dVar16 = 0.0;
        if (this->b->epsilon <= dVar15 / dVar14) {
          in_stack_ffffffffffffff20 = (double *)0x12e83d;
          dVar16 = orient3d((double *)ppdVar9,(double *)pa,this->dummypoint,endpt);
        }
        if (0.0 <= dVar17) {
          if (0.0 <= dVar16) {
            if (0.0 < dVar17) {
              if (dVar16 <= 0.0) {
                lVar3 = (long)searchsh->shver;
                goto LAB_0012ea69;
              }
              bVar2 = true;
              bVar12 = false;
              bVar13 = false;
              goto LAB_0012ea86;
            }
            if (dVar16 <= 0.0) {
              puVar5 = (undefined4 *)__cxa_allocate_exception(4);
              *puVar5 = 2;
              __cxa_throw(puVar5,&int::typeinfo,0);
            }
            bVar13 = true;
            bVar12 = false;
            goto LAB_0012ea84;
          }
LAB_0012e902:
          pppdVar4 = searchsh->sh;
          iVar10 = snextpivot[snextpivot[searchsh->shver]] >> 1;
          if ((chkencflag != 0) && (pppdVar4[(long)iVar10 + 6] != (shellface)0x0)) {
            searchsh->shver = snextpivot[snextpivot[searchsh->shver]];
            return ACROSSEDGE;
          }
          pppdVar7 = (shellface *)((ulong)pppdVar4[iVar10] & 0xfffffffffffffff8);
          if (pppdVar7 == (shellface *)0x0) {
            iVar10 = searchsh->shver >> 1;
            if ((chkencflag != 0) && (pppdVar4[(long)iVar10 + 6] != (shellface)0x0)) {
              return ACROSSEDGE;
            }
            uVar8 = (uint)pppdVar4[iVar10] & 7;
            pppdVar4 = (shellface *)((ulong)pppdVar4[iVar10] & 0xfffffffffffffff8);
            uVar8 = pppdVar4[sorgpivot[uVar8]] != ppdVar1 ^ uVar8;
            searchsh->sh = pppdVar4;
LAB_0012e9aa:
            uVar8 = snextpivot[uVar8];
          }
          else {
            uVar8 = (uint)pppdVar4[iVar10] & 7;
            uVar8 = pppdVar7[sdestpivot[uVar8]] != ppdVar9 ^ uVar8;
            searchsh->sh = pppdVar7;
          }
        }
        else {
          if ((dVar16 < 0.0) &&
             (uVar6 = (this->randomseed * 0x556 + 0x24d69) % 0xae529, this->randomseed = uVar6,
             (uVar6 & 1) != 0)) goto LAB_0012e902;
          if ((chkencflag != 0) &&
             (searchsh->sh[(long)(searchsh->shver >> 1) + 6] != (shellface)0x0)) {
            return ACROSSEDGE;
          }
          pppdVar4 = searchsh->sh;
          pppdVar7 = (shellface *)((ulong)pppdVar4[searchsh->shver >> 1] & 0xfffffffffffffff8);
          if (pppdVar7 != (shellface *)0x0) {
            uVar8 = (uint)pppdVar4[searchsh->shver >> 1] & 7;
            uVar8 = pppdVar7[sorgpivot[uVar8]] != ppdVar1 ^ uVar8;
            searchsh->sh = pppdVar7;
            goto LAB_0012e9aa;
          }
          iVar10 = snextpivot[snextpivot[searchsh->shver]] >> 1;
          if ((chkencflag != 0) && (pppdVar4[(long)iVar10 + 6] != (shellface)0x0)) {
            searchsh->shver = snextpivot[snextpivot[searchsh->shver]];
            return ACROSSEDGE;
          }
          uVar8 = (uint)pppdVar4[iVar10] & 7;
          pppdVar4 = (shellface *)((ulong)pppdVar4[iVar10] & 0xfffffffffffffff8);
          uVar8 = pppdVar4[sdestpivot[uVar8]] != ppdVar9 ^ uVar8;
          searchsh->sh = pppdVar4;
        }
        this_00 = sdestpivot;
        searchsh->shver = uVar8;
        pppdVar4 = searchsh->sh;
        lVar3 = (long)(int)uVar8;
        ppdVar1 = pppdVar4[sdestpivot[lVar3]];
      }
      bVar13 = false;
      bVar12 = true;
LAB_0012ea84:
      bVar2 = false;
LAB_0012ea86:
      if (bVar12) {
        if (insertsegflag != 0) {
          newseg.sh = (shellface *)0x0;
          newseg.shver = 0;
          makeshellface(this,this->subsegs,&newseg);
          uVar6 = (ulong)newseg.shver;
          newseg.sh[sorgpivot[uVar6]] = (shellface)pa;
          newseg.sh[sdestpivot[uVar6]] = (shellface)endpt;
          newseg.sh[sapexpivot[uVar6]] = (shellface)0x0;
          *(undefined4 *)((long)newseg.sh + (long)this->shmarkindex * 4) = 0xffffffff;
          iVar10 = searchsh->shver;
          lVar3 = (long)(iVar10 >> 1);
          searchsh->sh[lVar3 + 6] = (shellface)(uVar6 | (ulong)newseg.sh);
          *newseg.sh = (shellface)((long)iVar10 | (ulong)searchsh->sh);
          ppdVar1 = searchsh->sh[lVar3];
          if (((ulong)ppdVar1 & 0xfffffffffffffff8) != 0) {
            *(shellface *)
             (((ulong)ppdVar1 & 0xfffffffffffffff8) + 0x30 + (ulong)((uint)ppdVar1 & 6) * 4) =
                 (shellface)(uVar6 | (ulong)newseg.sh);
            *newseg.sh = ppdVar1;
          }
          return SHAREEDGE;
        }
        return SHAREEDGE;
      }
      if (bVar13) {
        if (reporterrorflag != 0) {
          ppdVar1 = searchsh->sh[sdestpivot[searchsh->shver]];
          printf("PLC Error:  A vertex lies in a segment in facet #%d.\n",
                 (ulong)*(uint *)((long)searchsh->sh + (long)this->shmarkindex * 4));
          printf("  Vertex:  [%d] (%g,%g,%g).\n",*ppdVar1,ppdVar1[1],ppdVar1[2],
                 (ulong)*(uint *)((long)ppdVar1 + (long)this->pointmarkindex * 4));
          printf("  Segment: [%d, %d]\n",
                 (ulong)*(uint *)((long)&pa->in + (long)this->pointmarkindex * 4),
                 (ulong)*(uint *)((long)endpt + (long)this->pointmarkindex * 4));
        }
        return ACROSSVERT;
      }
    } while (!bVar2);
    flipshs[0].sh = searchsh->sh;
    flipshs[0].shver = snextpivot[searchsh->shver];
    if (flipshs[0].sh[(long)(flipshs[0].shver >> 1) + 6] != (shellface)0x0) {
      if (reporterrorflag != 0) {
        tp = 0.0;
        tq = 0.0;
        linelineint(this,(double *)pa,endpt,(double *)ppdVar1,(double *)ppdVar9,(double *)&newseg,
                    &tp,&tq,in_stack_ffffffffffffff20);
        printf("PLC Error:  Two segments intersect at point (%g,%g,%g),",newseg.sh,
               CONCAT44(newseg._12_4_,newseg.shver),local_68);
        printf(" in facet #%d.\n",(ulong)*(uint *)((long)searchsh->sh + (long)this->shmarkindex * 4)
              );
        printf("  Segment 1: [%d, %d]\n",
               (ulong)*(uint *)((long)ppdVar1 + (long)this->pointmarkindex * 4),
               (ulong)*(uint *)((long)ppdVar9 + (long)this->pointmarkindex * 4));
        printf("  Segment 2: [%d, %d]\n",
               (ulong)*(uint *)((long)&pa->in + (long)this->pointmarkindex * 4),
               (ulong)*(uint *)((long)endpt + (long)this->pointmarkindex * 4));
      }
      return ACROSSEDGE;
    }
    flipshs[1].shver = (uint)flipshs[0].sh[flipshs[0].shver >> 1] & 7;
    flipshs[1].sh = (shellface *)((ulong)flipshs[0].sh[flipshs[0].shver >> 1] & 0xfffffffffffffff8);
    if (flipshs[1].sh[sorgpivot[(uint)flipshs[1].shver]] !=
        flipshs[0].sh[sdestpivot[flipshs[0].shver]]) {
      flipshs[1].shver = flipshs[1].shver ^ 1;
    }
    flipfaces = flipshs;
    flip22(this,flipfaces,1,0);
    iVar10 = flipshs[0].shver;
    pppdVar4 = flipshs[0].sh;
    ppdVar1 = flipshs[1].sh[sapexpivot[flipshs[1].shver]];
    lVar3 = (long)flipshs[0].shver;
    ppdVar9 = flipshs[0].sh[sorgpivot[lVar3]];
    pb = flipshs[0].sh[sdestpivot[lVar3]];
    dVar14 = orient3d((double *)ppdVar9,(double *)pb,this->dummypoint,
                      (double *)flipshs[0].sh[sapexpivot[lVar3]]);
    in_stack_ffffffffffffff20 = (double *)0x12edbc;
    dVar15 = orient3d((double *)pb,(double *)ppdVar9,this->dummypoint,(double *)ppdVar1);
    if (dVar14 <= 0.0) {
LAB_0012edd3:
      in_stack_ffffffffffffff20 = (double *)0x12ede0;
      flipshpush(this,flipfaces);
    }
    else if (dVar15 <= 0.0) {
      flipfaces = flipshs + 1;
      goto LAB_0012edd3;
    }
    searchsh->sh = pppdVar4;
    searchsh->shver = iVar10;
  } while( true );
}

Assistant:

enum tetgenmesh::interresult tetgenmesh::sscoutsegment(face *searchsh, 
  point endpt, int insertsegflag, int reporterrorflag, int chkencflag)
{
  face flipshs[2], neighsh;
  point startpt, pa, pb, pc, pd;
  enum interresult dir;
  enum {MOVE_AB, MOVE_CA} nextmove;
  REAL ori_ab, ori_ca, len;

  // The origin of 'searchsh' is fixed.
  startpt = sorg(*searchsh); 
  nextmove = MOVE_AB; // Avoid compiler warning.

  if (b->verbose > 2) {
    printf("      Scout segment (%d, %d).\n", pointmark(startpt),
           pointmark(endpt));
  }
  len = distance(startpt, endpt);

  // Search an edge in 'searchsh' on the path of this segment.
  while (1) {

    pb = sdest(*searchsh);
    if (pb == endpt) {
      dir = SHAREEDGE; // Found!
      break;
    }

    pc = sapex(*searchsh);
    if (pc == endpt) {
      senext2self(*searchsh);
      sesymself(*searchsh);
      dir = SHAREEDGE; // Found!
      break;
    }


    // Round the results.
    if ((sqrt(triarea(startpt, pb, endpt)) / len) < b->epsilon) {
      ori_ab = 0.0;
    } else {
      ori_ab = orient3d(startpt, pb, dummypoint, endpt);
    }
    if ((sqrt(triarea(pc, startpt, endpt)) / len) < b->epsilon) {
      ori_ca = 0.0;
    } else {
      ori_ca = orient3d(pc, startpt, dummypoint, endpt);
    }

    if (ori_ab < 0) {
      if (ori_ca < 0) { // (--)
        // Both sides are viable moves.
        if (randomnation(2)) {
          nextmove = MOVE_CA;
        } else {
          nextmove = MOVE_AB;
        }
      } else { // (-#)
        nextmove = MOVE_AB;
      }
    } else {
      if (ori_ca < 0) { // (#-)
        nextmove = MOVE_CA;
      } else {
        if (ori_ab > 0) {
          if (ori_ca > 0) { // (++)
            // The segment intersects with edge [b, c].
            dir = ACROSSEDGE;
            break;
          } else { // (+0)
            // The segment collinear with edge [c, a].
            senext2self(*searchsh);
            sesymself(*searchsh); 
            dir = ACROSSVERT;
            break;
          }
        } else {
          if (ori_ca > 0) { // (0+)
            // The segment is collinear with edge [a, b].
            dir = ACROSSVERT;
            break;
          } else { // (00)
            // startpt == endpt. Not possible.
            terminatetetgen(this, 2);
          }
        }
      }
    }

    // Move 'searchsh' to the next face, keep the origin unchanged.
    if (nextmove == MOVE_AB) {
      if (chkencflag) {
        // Do not cross boundary.
        if (isshsubseg(*searchsh)) {
          return ACROSSEDGE; // ACROSS_SEG
        }
      }
      spivot(*searchsh, neighsh);
      if (neighsh.sh != NULL) {
        if (sorg(neighsh) != pb) sesymself(neighsh);
        senext(neighsh, *searchsh);
      } else {
        // This side (startpt->pb) is outside. It is caused by rounding error.
        // Try the next side, i.e., (pc->startpt).
        senext2(*searchsh, neighsh);
        if (chkencflag) {
          // Do not cross boundary.
          if (isshsubseg(neighsh)) {
            *searchsh = neighsh;
            return ACROSSEDGE; // ACROSS_SEG
          }
        }
        spivotself(neighsh);
        if (sdest(neighsh) != pc) sesymself(neighsh);
        *searchsh = neighsh;
      }
    } else { // MOVE_CA
      senext2(*searchsh, neighsh);
      if (chkencflag) {
        // Do not cross boundary.
        if (isshsubseg(neighsh)) {
          *searchsh = neighsh;
          return ACROSSEDGE; // ACROSS_SEG
        }
      }
      spivotself(neighsh);
      if (neighsh.sh != NULL) {
        if (sdest(neighsh) != pc) sesymself(neighsh);
        *searchsh = neighsh;
      } else {
        // The same reason as above. 
        // Try the next side, i.e., (startpt->pb).
        if (chkencflag) {
          // Do not cross boundary.
          if (isshsubseg(*searchsh)) {
            return ACROSSEDGE; // ACROSS_SEG
          }
        }
        spivot(*searchsh, neighsh);
        if (sorg(neighsh) != pb) sesymself(neighsh);
        senext(neighsh, *searchsh);
      }
    }
  } // while

  if (dir == SHAREEDGE) {
    if (insertsegflag) {
      // Insert the segment into the triangulation.
      face newseg;
      makeshellface(subsegs, &newseg);
      setshvertices(newseg, startpt, endpt, NULL);
      // Set the default segment marker.
      setshellmark(newseg, -1);
      ssbond(*searchsh, newseg);
      spivot(*searchsh, neighsh);
      if (neighsh.sh != NULL) {
        ssbond(neighsh, newseg);
      }
    }
    return dir;
  }

  if (dir == ACROSSVERT) {
    // A point is found collinear with this segment.
    if (reporterrorflag) {
      point pp = sdest(*searchsh);
      printf("PLC Error:  A vertex lies in a segment in facet #%d.\n",
             shellmark(*searchsh));
      printf("  Vertex:  [%d] (%g,%g,%g).\n",pointmark(pp),pp[0],pp[1],pp[2]);
      printf("  Segment: [%d, %d]\n", pointmark(startpt), pointmark(endpt));
    }
    return dir;
  }

  if (dir == ACROSSEDGE) {
    // Edge [b, c] intersects with the segment.
    senext(*searchsh, flipshs[0]);
    if (isshsubseg(flipshs[0])) {
      if (reporterrorflag) {
        REAL P[3], Q[3], tp = 0, tq = 0;
        linelineint(startpt, endpt, pb, pc, P, Q, &tp, &tq);
        printf("PLC Error:  Two segments intersect at point (%g,%g,%g),", 
               P[0], P[1], P[2]);
        printf(" in facet #%d.\n", shellmark(*searchsh));
        printf("  Segment 1: [%d, %d]\n", pointmark(pb), pointmark(pc));
        printf("  Segment 2: [%d, %d]\n", pointmark(startpt),pointmark(endpt));
      }
      return dir; // ACROSS_SEG
    }
    // Flip edge [b, c], queue unflipped edges (for Delaunay checks).
    spivot(flipshs[0], flipshs[1]);
    if (sorg(flipshs[1]) != sdest(flipshs[0])) sesymself(flipshs[1]);
    flip22(flipshs, 1, 0);
    // The flip may create an inverted triangle, check it.
    pa = sapex(flipshs[1]);
    pb = sapex(flipshs[0]);
    pc = sorg(flipshs[0]);
    pd = sdest(flipshs[0]);
    // Check if pa and pb are on the different sides of [pc, pd]. 
    // Re-use ori_ab, ori_ca for the tests.
    ori_ab = orient3d(pc, pd, dummypoint, pb);
    ori_ca = orient3d(pd, pc, dummypoint, pa);
    if (ori_ab <= 0) {
      flipshpush(&(flipshs[0])); 
    } else if (ori_ca <= 0) {
      flipshpush(&(flipshs[1])); 
    }
    // Set 'searchsh' s.t. its origin is 'startpt'.
    *searchsh = flipshs[0];
  }

  return sscoutsegment(searchsh, endpt, insertsegflag, reporterrorflag, 
                       chkencflag);
}